

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchmanager.cpp
# Opt level: O2

void __thiscall QEvdevTouchManager::addDevice(QEvdevTouchManager *this,QString *deviceNode)

{
  QLoggingCategory *pQVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  Data *local_58;
  undefined1 local_50 [8];
  QString local_48;
  undefined4 uStack_30;
  undefined4 local_2c;
  Data *local_28;
  char16_t *local_20;
  
  local_20 = *(char16_t **)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcEvdevTouch();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_28 = (Data *)pQVar1->name;
    local_48.d.ptr._0_4_ = 2;
    local_48.d.ptr._4_4_ = 0;
    local_48.d.size._0_4_ = 0;
    local_48.d.size._4_4_ = 0;
    uStack_30 = 0;
    local_2c = 0;
    uVar2 = QString::utf16();
    QMessageLogger::debug((char *)&local_48.d.ptr,"evdevtouch: Adding device at %ls",uVar2);
  }
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  std::make_unique<QEvdevTouchScreenHandlerThread,QString_const&,QString&>(&local_48,deviceNode);
  if (local_48.d.d == (Data *)0x0) {
    local_48.d.ptr._0_4_ = 2;
    local_2c = 0;
    local_48.d.ptr._4_4_ = 0;
    local_48.d.size._0_4_ = 0;
    local_48.d.size._4_4_ = 0;
    uStack_30 = 0;
    local_28 = (Data *)0x1141d9;
    uVar2 = QString::utf16();
    QMessageLogger::warning
              ((char *)&local_48.d.ptr,"evdevtouch: Failed to open touch device %ls",uVar2);
  }
  else {
    local_48.d.ptr._0_4_ = 0x108074;
    local_48.d.ptr._4_4_ = 0;
    local_48.d.size._0_4_ = 0;
    local_48.d.size._4_4_ = 0;
    QObject::connect<void(QEvdevTouchScreenHandlerThread::*)(),void(QEvdevTouchManager::*)()>
              ((Object *)local_50,(offset_in_QEvdevTouchScreenHandlerThread_to_subr)local_48.d.d,
               (ContextType *)QEvdevTouchScreenHandlerThread::touchDeviceRegistered,
               (offset_in_QEvdevTouchManager_to_subr *)0x0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_50);
    local_58 = local_48.d.d;
    local_48.d.d = (Data *)0x0;
    QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::add
              (&this->m_activeDevices,deviceNode,
               (unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
                )&local_58);
    if (local_58 != (Data *)0x0) {
      (**(code **)(*(long *)&local_58->super_QArrayData + 0x20))();
    }
    local_58 = (Data *)0x0;
  }
  if (local_48.d.d != (Data *)0x0) {
    (**(code **)(*(long *)&(local_48.d.d)->super_QArrayData + 0x20))();
  }
  if (*(char16_t **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevTouchManager::addDevice(const QString &deviceNode)
{
    qCDebug(qLcEvdevTouch, "evdevtouch: Adding device at %ls", qUtf16Printable(deviceNode));
    auto handler = std::make_unique<QEvdevTouchScreenHandlerThread>(deviceNode, m_spec);
    if (handler) {
        connect(handler.get(), &QEvdevTouchScreenHandlerThread::touchDeviceRegistered, this, &QEvdevTouchManager::updateInputDeviceCount);
        m_activeDevices.add(deviceNode, std::move(handler));
    } else {
        qWarning("evdevtouch: Failed to open touch device %ls", qUtf16Printable(deviceNode));
    }
}